

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O0

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  int axis;
  int i;
  int *axes_ptr;
  bool _squeeze_c;
  bool _squeeze_h;
  bool _squeeze_w;
  int dims;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffc80;
  Mat *in_stack_fffffffffffffc88;
  Mat *this_00;
  Allocator *in_stack_fffffffffffffcb8;
  int _h;
  undefined1 *in_stack_fffffffffffffcc0;
  int iVar2;
  Mat *in_stack_fffffffffffffcc8;
  bool local_32b;
  bool local_32a;
  bool local_329;
  Mat local_2e0;
  Mat local_2a0 [6];
  Allocator local_120 [64];
  undefined1 local_e0 [80];
  Mat local_90;
  int local_50;
  int local_4c;
  int *local_48;
  bool local_3b;
  bool local_3a;
  bool local_39;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_38 = *(int *)(in_RSI + 0x28);
  local_39 = false;
  local_3a = false;
  local_3b = false;
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc80);
  if (bVar1) {
    local_329 = false;
    if (local_2c == 1) {
      local_329 = *(int *)(in_RDI + 0xb8) != 0;
    }
    local_39 = local_329;
    local_32a = false;
    if (local_30 == 1) {
      local_32a = *(int *)(in_RDI + 0xbc) != 0;
    }
    local_3a = local_32a;
    local_32b = false;
    if (local_34 == 1) {
      local_32b = *(int *)(in_RDI + 0xc0) != 0;
    }
    local_3b = local_32b;
  }
  else {
    local_48 = ncnn::Mat::operator_cast_to_int_((Mat *)(in_RDI + 200));
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0xf4); local_4c = local_4c + 1) {
      local_50 = local_48[local_4c];
      if (local_50 < 0) {
        local_50 = local_38 + 1 + local_50;
      }
      if ((local_38 == 1) && (local_50 == 1)) {
        local_39 = local_2c == 1;
      }
      if ((local_38 == 2) && (local_50 == 1)) {
        local_3a = local_30 == 1;
      }
      if ((local_38 == 2) && (local_50 == 2)) {
        local_39 = local_2c == 1;
      }
      if ((local_38 == 3) && (local_50 == 1)) {
        local_3b = local_34 == 1;
      }
      if ((local_38 == 3) && (local_50 == 2)) {
        local_3a = local_30 == 1;
      }
      if ((local_38 == 3) && (local_50 == 3)) {
        local_39 = local_2c == 1;
      }
    }
  }
  ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  if ((local_38 == 1) && ((local_39 & 1U) != 0)) {
    in_stack_fffffffffffffcc8 = &local_90;
    ncnn::Mat::reshape(in_stack_fffffffffffffcc8,(int)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                       in_stack_fffffffffffffcb8);
    ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    ncnn::Mat::~Mat((Mat *)0x1ea299);
  }
  if (local_38 == 2) {
    if (((local_39 & 1U) == 0) || ((local_3a & 1U) == 0)) {
      iVar2 = (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
      if ((local_39 & 1U) == 0) {
        if ((local_3a & 1U) != 0) {
          ncnn::Mat::reshape(in_stack_fffffffffffffcc8,iVar2,in_stack_fffffffffffffcb8);
          ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          ncnn::Mat::~Mat((Mat *)0x1ea43b);
        }
      }
      else {
        in_stack_fffffffffffffcb8 = local_120;
        ncnn::Mat::reshape(in_stack_fffffffffffffcc8,iVar2,in_stack_fffffffffffffcb8);
        ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
        ncnn::Mat::~Mat((Mat *)0x1ea3b8);
      }
    }
    else {
      in_stack_fffffffffffffcc0 = local_e0;
      ncnn::Mat::reshape(in_stack_fffffffffffffcc8,(int)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                         in_stack_fffffffffffffcb8);
      ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      ncnn::Mat::~Mat((Mat *)0x1ea335);
    }
  }
  if (local_38 == 3) {
    iVar2 = (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
    if ((((local_39 & 1U) == 0) || ((local_3a & 1U) == 0)) || ((local_3b & 1U) == 0)) {
      if (((local_39 & 1U) == 0) || ((local_3a & 1U) == 0)) {
        if (((local_3a & 1U) == 0) || ((local_3b & 1U) == 0)) {
          if (((local_39 & 1U) == 0) || ((local_3b & 1U) == 0)) {
            _h = (int)in_stack_fffffffffffffcc0;
            if ((local_39 & 1U) == 0) {
              if ((local_3a & 1U) == 0) {
                if ((local_3b & 1U) != 0) {
                  ncnn::Mat::reshape(in_stack_fffffffffffffcc8,iVar2,_h,in_stack_fffffffffffffcb8);
                  ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
                  ncnn::Mat::~Mat((Mat *)0x1ea83a);
                }
              }
              else {
                in_stack_fffffffffffffc80 = &local_2e0;
                ncnn::Mat::reshape(in_stack_fffffffffffffcc8,iVar2,_h,in_stack_fffffffffffffcb8);
                ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
                ncnn::Mat::~Mat((Mat *)0x1ea7b8);
              }
            }
            else {
              this_00 = local_2a0;
              ncnn::Mat::reshape(in_stack_fffffffffffffcc8,iVar2,_h,in_stack_fffffffffffffcb8);
              ncnn::Mat::operator=(this_00,in_stack_fffffffffffffc80);
              ncnn::Mat::~Mat((Mat *)0x1ea72a);
            }
          }
          else {
            ncnn::Mat::reshape(in_stack_fffffffffffffcc8,iVar2,in_stack_fffffffffffffcb8);
            ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
            ncnn::Mat::~Mat((Mat *)0x1ea69c);
          }
        }
        else {
          ncnn::Mat::reshape(in_stack_fffffffffffffcc8,iVar2,in_stack_fffffffffffffcb8);
          ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          ncnn::Mat::~Mat((Mat *)0x1ea60b);
        }
      }
      else {
        ncnn::Mat::reshape(in_stack_fffffffffffffcc8,iVar2,in_stack_fffffffffffffcb8);
        ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
        ncnn::Mat::~Mat((Mat *)0x1ea57a);
      }
    }
    else {
      ncnn::Mat::reshape(in_stack_fffffffffffffcc8,iVar2,in_stack_fffffffffffffcb8);
      ncnn::Mat::operator=(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      ncnn::Mat::~Mat((Mat *)0x1ea4e9);
    }
  }
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc80);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i=0; i<axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;// +1 for N-dim

            if (dims == 1 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 3)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}